

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureVkImpl.cpp
# Opt level: O2

CACHE_GROUP
Diligent::PipelineResourceSignatureVkImpl::GetResourceCacheGroup(PipelineResourceDesc *Res)

{
  SHADER_RESOURCE_VARIABLE_TYPE SVar1;
  SHADER_RESOURCE_TYPE SVar2;
  
  SVar1 = Res->VarType;
  if ((Res->Flags &
      (PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER|PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS)) ==
      PIPELINE_RESOURCE_FLAG_NONE) {
    SVar2 = Res->ResourceType;
    if ((SVar2 == SHADER_RESOURCE_TYPE_BUFFER_UAV) || (SVar2 == SHADER_RESOURCE_TYPE_BUFFER_SRV)) {
      return (ulong)(SVar1 == SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC) * 3 + CACHE_GROUP_DYN_SB;
    }
    if (SVar2 == SHADER_RESOURCE_TYPE_CONSTANT_BUFFER) {
      return (ulong)(SVar1 == SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC) * 3;
    }
  }
  return (ulong)(SVar1 == SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC) * 3 + CACHE_GROUP_OTHER;
}

Assistant:

inline PipelineResourceSignatureVkImpl::CACHE_GROUP PipelineResourceSignatureVkImpl::GetResourceCacheGroup(const PipelineResourceDesc& Res)
{
    // NB: SetId is always 0 for static/mutable variables, and 1 - for dynamic ones.
    //     It is not the actual descriptor set index in the set layout!
    const size_t SetId             = VarTypeToDescriptorSetId(Res.VarType);
    const bool   WithDynamicOffset = (Res.Flags & PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS) == 0;
    const bool   UseTexelBuffer    = (Res.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) != 0;

    if (WithDynamicOffset && !UseTexelBuffer)
    {
        if (Res.ResourceType == SHADER_RESOURCE_TYPE_CONSTANT_BUFFER)
            return static_cast<CACHE_GROUP>(SetId * CACHE_GROUP_COUNT_PER_VAR_TYPE + CACHE_GROUP_DYN_UB);

        if (Res.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV || Res.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV)
            return static_cast<CACHE_GROUP>(SetId * CACHE_GROUP_COUNT_PER_VAR_TYPE + CACHE_GROUP_DYN_SB);
    }
    return static_cast<CACHE_GROUP>(SetId * CACHE_GROUP_COUNT_PER_VAR_TYPE + CACHE_GROUP_OTHER);
}